

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::blitTo
          (GLFrameBuffer *this,FrameBuffer *targetIn)

{
  long lVar1;
  allocator local_31;
  string local_30;
  
  if (targetIn != (FrameBuffer *)0x0) {
    lVar1 = __dynamic_cast(targetIn,&FrameBuffer::typeinfo,&typeinfo,0);
    if (lVar1 != 0) goto LAB_00234cc8;
  }
  std::__cxx11::string::string((string *)&local_30,"tried to blitTo() non-GL framebuffer",&local_31)
  ;
  exception(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  lVar1 = 0;
LAB_00234cc8:
  (*(this->super_FrameBuffer)._vptr_FrameBuffer[3])(this);
  (*glad_glBindFramebuffer)(0x8ca9,*(GLuint *)(lVar1 + 0xa8));
  (*glad_glBlitFramebuffer)
            (0,0,(this->super_FrameBuffer).sizeX,(this->super_FrameBuffer).sizeY,0,0,
             *(GLint *)(lVar1 + 0x1c),*(GLint *)(lVar1 + 0x20),0x4000,0x2601);
  checkGLError(true);
  return;
}

Assistant:

void GLFrameBuffer::blitTo(FrameBuffer* targetIn) {

  // it _better_ be a GL buffer
  GLFrameBuffer* target = dynamic_cast<GLFrameBuffer*>(targetIn);
  if (!target) exception("tried to blitTo() non-GL framebuffer");

  // target->bindForRendering();
  bindForRendering();
  glBindFramebuffer(GL_DRAW_FRAMEBUFFER, target->getHandle());

  glBlitFramebuffer(0, 0, getSizeX(), getSizeY(), 0, 0, target->getSizeX(), target->getSizeY(), GL_COLOR_BUFFER_BIT,
                    GL_LINEAR);
  checkGLError();
}